

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

int IgnorePlugin(char *pluginId)

{
  int iVar1;
  char *in_RDI;
  int i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (IgnorePlugin::ignoredPlugins[local_14] == (char *)0x0) {
      return 0;
    }
    iVar1 = strcmp(in_RDI,IgnorePlugin::ignoredPlugins[local_14]);
    if (iVar1 == 0) break;
    local_14 = local_14 + 1;
  }
  return 1;
}

Assistant:

static int IgnorePlugin( const char *pluginId )
{
    static const char *ignoredPlugins[] = {"hw", "plughw", "plug", "dsnoop", "tee",
        "file", "null", "shm", "cards", "rate_convert", NULL};
    int i = 0;
    while( ignoredPlugins[i] )
    {
        if( !strcmp( pluginId, ignoredPlugins[i] ) )
        {
            return 1;
        }
        ++i;
    }

    return 0;
}